

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Command * __thiscall
cmState::GetDependencyProviderCommand(Command *__return_storage_ptr__,cmState *this,Method method)

{
  bool bVar1;
  cmDependencyProvider *pcVar2;
  string *name;
  Method method_local;
  cmState *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->DependencyProvider);
  if (bVar1) {
    pcVar2 = std::optional<cmDependencyProvider>::operator->(&this->DependencyProvider);
    bVar1 = cmDependencyProvider::SupportsMethod(pcVar2,method);
    if (bVar1) {
      pcVar2 = std::optional<cmDependencyProvider>::operator->(&this->DependencyProvider);
      name = cmDependencyProvider::GetCommand_abi_cxx11_(pcVar2);
      GetCommand(__return_storage_ptr__,this,name);
      return __return_storage_ptr__;
    }
  }
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::function(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

cmState::Command cmState::GetDependencyProviderCommand(
  cmDependencyProvider::Method method) const
{
  return (this->DependencyProvider &&
          this->DependencyProvider->SupportsMethod(method))
    ? this->GetCommand(this->DependencyProvider->GetCommand())
    : Command{};
}